

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x8cc340;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x8cc430;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x8cc368;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x8cc390;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x8cc3b8;
  this[-1].CapacityByWeight.ptr = 4.55784649096433e-317;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8cc408;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__008cc448);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}